

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

void __thiscall ODDLParser::DDLNode::detachParent(DDLNode *this)

{
  DDLNode *pDVar1;
  bool bVar2;
  const_iterator local_40;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  local_38;
  DDLNode *local_30;
  DDLNode **local_28;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  local_20;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  local_18;
  DDLNodeIt it;
  DDLNode *this_local;
  
  if (this->m_parent != (DDLNode *)0x0) {
    it._M_current = (DDLNode **)this;
    local_20._M_current =
         (DDLNode **)
         std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::begin
                   (&this->m_parent->m_children);
    local_28 = (DDLNode **)
               std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::end
                         (&this->m_parent->m_children);
    local_30 = this;
    local_18 = std::
               find<__gnu_cxx::__normal_iterator<ODDLParser::DDLNode**,std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>>,ODDLParser::DDLNode*>
                         (local_20,(__normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                                    )local_28,&local_30);
    local_38._M_current =
         (DDLNode **)
         std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::end
                   (&this->m_parent->m_children);
    bVar2 = __gnu_cxx::operator!=(&local_38,&local_18);
    if (bVar2) {
      pDVar1 = this->m_parent;
      __gnu_cxx::
      __normal_iterator<ODDLParser::DDLNode*const*,std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>>
      ::__normal_iterator<ODDLParser::DDLNode**>
                ((__normal_iterator<ODDLParser::DDLNode*const*,std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>>
                  *)&local_40,&local_18);
      std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::erase
                (&pDVar1->m_children,local_40);
    }
    this->m_parent = (DDLNode *)0x0;
  }
  return;
}

Assistant:

void DDLNode::detachParent() {
    if( ddl_nullptr != m_parent ) {
        DDLNodeIt it = std::find( m_parent->m_children.begin(), m_parent->m_children.end(), this );
        if( m_parent->m_children.end() != it ) {
            m_parent->m_children.erase( it );
        }
        m_parent = ddl_nullptr;
    }
}